

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall
helics::apps::Recorder::Recorder
          (Recorder *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  Recorder *in_RSI;
  undefined8 *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000138;
  App *in_stack_00000140;
  undefined1 in_stack_00000148 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff30;
  Recorder *this_00;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  App::App(in_stack_00000140,(string_view)in_stack_00000148,in_stack_00000138);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff40);
  *in_RDI = &PTR__Recorder_00922960;
  *(undefined1 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)((long)in_RDI + 0xa1) = 0;
  in_RDI[0x15] = 0;
  std::unique_ptr<helics::CloningFilter,std::default_delete<helics::CloningFilter>>::
  unique_ptr<std::default_delete<helics::CloningFilter>,void>
            ((unique_ptr<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_> *)
             in_stack_ffffffffffffff30);
  CLI::std::
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  ::vector((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
            *)0x176987);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::deque
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)0x1769a0);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1769bb);
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::deque
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x1769d4);
  this_00 = (Recorder *)(in_RDI + 0x31);
  std::unique_ptr<helics::Endpoint,std::default_delete<helics::Endpoint>>::
  unique_ptr<std::default_delete<helics::Endpoint>,void>
            ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)this_00);
  CLI::std::
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  ::vector((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
            *)0x176a08);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x35);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x176a21);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x176a3a);
  CLI::std::
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  ::map((map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
         *)0x176a53);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x176a6c);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  vector((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
          *)0x176a85);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x176a9e);
  std::__cxx11::string::string(this_01);
  processArgs(in_RSI);
  initialSetup(this_00);
  return;
}

Assistant:

Recorder::Recorder(std::vector<std::string> args): App("recorder", std::move(args))
{
    processArgs();
    initialSetup();
}